

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vocab.c
# Opt level: O2

void ReadUTF8_test(FILE *fp)

{
  uint32_t uVar1;
  uint32_t uVar2;
  HashVocab vocab;
  char *pcVar3;
  size_t sVar4;
  
  fgets(iobuf,200000,(FILE *)fp);
  vocab = HashVocab_init_from_bin(rom);
  do {
    pcVar3 = fgets(iobuf,200000,(FILE *)fp);
    if (pcVar3 == (char *)0x0) {
      return;
    }
    sVar4 = strlen(iobuf);
    if ((&DAT_001040af)[sVar4] == '\n') {
      (&DAT_001040af)[sVar4] = 0;
    }
    uVar1 = HashVocab_id(::vocab,iobuf);
    uVar2 = HashVocab_id(vocab,iobuf);
  } while (uVar1 == uVar2);
  __assert_fail("id1 == id2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/test_vocab.c"
                ,0x26,"void ReadUTF8_test(FILE *)");
}

Assistant:

void ReadUTF8_test(FILE* fp)
{
    fgets((char*)iobuf, sizeof(iobuf), fp);
    //int word_num = atoi(iobuf);
    HashVocab vocab2 = HashVocab_init_from_bin(rom);
    while( fgets((char*)iobuf, sizeof(iobuf), fp))
    {
        size_t len = strlen(iobuf);
        if (iobuf[len-1] == '\n') {
            iobuf[len-1] = 0;
        }
        uint32_t id1 = HashVocab_id(vocab, iobuf);
        uint32_t id2 = HashVocab_id(vocab2, iobuf);
        assert(id1 == id2);
    }
}